

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O1

void rw::hAnimFrameWrite(Stream *stream,Animation *anim)

{
  void *pvVar1;
  long lVar2;
  void *data;
  
  if (0 < anim->numFrames) {
    pvVar1 = anim->keyframes;
    data = (void *)((long)pvVar1 + 0x1c);
    lVar2 = 0;
    do {
      Stream::writeF32(stream,*(float32 *)((long)data + -0x14));
      Stream::write32(stream,(void *)((long)data + -0x10),0x10);
      Stream::write32(stream,data,0xc);
      Stream::writeI32(stream,(int)((ulong)(*(long *)((long)data + -0x1c) - (long)pvVar1) >> 3) *
                              -0x3333332c);
      lVar2 = lVar2 + 1;
      data = (void *)((long)data + 0x28);
    } while (lVar2 < anim->numFrames);
  }
  return;
}

Assistant:

static void
hAnimFrameWrite(Stream *stream, Animation *anim)
{
	HAnimKeyFrame *frames = (HAnimKeyFrame*)anim->keyframes;
	for(int32 i = 0; i < anim->numFrames; i++){
		stream->writeF32(frames[i].time);
		stream->write32(&frames[i].q, 4*4);
		stream->write32(&frames[i].t, 3*4);
		stream->writeI32((frames[i].prev - frames)*0x24);
	}
}